

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.hpp
# Opt level: O2

bool __thiscall
deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<float[8]>::isUndefined
          (StateQueryMemoryWriteGuard<float[8]> *this)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0x20) break;
    uVar1 = uVar2 + 1;
  } while (*(char *)((long)this->m_value + uVar2) == -0x22);
  return 0x1f < uVar2;
}

Assistant:

bool StateQueryMemoryWriteGuard<T>::isUndefined () const
{
	for (size_t i = 0; i < sizeof(T); ++i)
		if (((deUint8*)&m_value)[i] != (deUint8)WRITE_GUARD_VALUE)
			return false;
	return true;
}